

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DesignatorPdu.cpp
# Opt level: O0

void __thiscall DIS::DesignatorPdu::unmarshal(DesignatorPdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  DesignatorPdu *this_local;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_designatingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_codeName);
  EntityID::unmarshal(&this->_designatedEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_designatorCode);
  DataStream::operator>>(dataStream,&this->_designatorPower);
  DataStream::operator>>(dataStream,&this->_designatorWavelength);
  Vector3Float::unmarshal(&this->_designatorSpotWrtDesignated,dataStream);
  Vector3Double::unmarshal(&this->_designatorSpotLocation,dataStream);
  DataStream::operator>>(dataStream,&this->_deadReckoningAlgorithm);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  Vector3Float::unmarshal(&this->_entityLinearAcceleration,dataStream);
  return;
}

Assistant:

void DesignatorPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _designatingEntityID.unmarshal(dataStream);
    dataStream >> _codeName;
    _designatedEntityID.unmarshal(dataStream);
    dataStream >> _designatorCode;
    dataStream >> _designatorPower;
    dataStream >> _designatorWavelength;
    _designatorSpotWrtDesignated.unmarshal(dataStream);
    _designatorSpotLocation.unmarshal(dataStream);
    dataStream >> _deadReckoningAlgorithm;
    dataStream >> _padding1;
    dataStream >> _padding2;
    _entityLinearAcceleration.unmarshal(dataStream);
}